

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O1

void __thiscall
xray_re::xr_mesh_vbuf::transform_normals
          (xr_mesh_vbuf *this,fvector3 *source,fvector3 *target,size_t size,fmatrix *xform)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  dmatrix m;
  double local_98 [4];
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_48;
  
  lVar1 = 0xf;
  do {
    local_98[lVar1] = (double)(xform->field_0).__array[lVar1];
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  dVar3 = local_98[2] * local_98[2] + local_98[0] * local_98[0] + local_98[1] * local_98[1];
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar5 = local_98[0] / dVar3;
  dVar6 = local_98[1] / dVar3;
  dVar3 = local_98[2] / dVar3;
  dVar4 = local_68 * local_68 + local_78 * local_78 + local_70 * local_70;
  local_98[0] = dVar5;
  local_98[1] = dVar6;
  local_98[2] = dVar3;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar10 = local_78 / dVar4;
  local_70 = local_70 / dVar4;
  local_68 = local_68 / dVar4;
  dVar4 = local_48 * local_48 + local_58 * local_58 + local_50 * local_50;
  if (dVar4 < 0.0) {
    local_78 = dVar10;
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if (size != 0) {
    lVar1 = 0;
    do {
      dVar8 = (double)*(float *)((long)&source->field_0 + lVar1);
      dVar9 = (double)*(float *)((long)&source->field_0 + lVar1 + 4);
      dVar7 = (double)*(float *)((long)&source->field_0 + lVar1 + 8);
      *(float *)((long)&target->field_0 + lVar1) =
           (float)((local_58 / dVar4) * dVar7 + dVar5 * dVar8 + dVar10 * dVar9);
      *(float *)((long)&target->field_0 + lVar1 + 4) =
           (float)((local_50 / dVar4) * dVar7 + dVar6 * dVar8 + local_70 * dVar9);
      *(float *)((long)&target->field_0 + lVar1 + 8) =
           (float)(dVar7 * (local_48 / dVar4) + dVar8 * dVar3 + dVar9 * local_68);
      lVar1 = lVar1 + 0xc;
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void xr_mesh_vbuf::transform_normals(const fvector3* source, fvector3* target, size_t size,
		const fmatrix& xform) const
{
	dmatrix m;
	m.set(xform);
	m.i.normalize();
	m.j.normalize();
	m.k.normalize();
	for (; size != 0; --size, ++target)
		target->set(dvector3().set(*source++).rotate(m));
}